

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptString::Concat3
          (JavascriptString *pstLeft,JavascriptString *pstCenter,JavascriptString *pstRight)

{
  ScriptContext *scriptContext;
  ConcatStringMulti *this;
  ConcatStringMulti *concatString;
  JavascriptString *pstRight_local;
  JavascriptString *pstCenter_local;
  JavascriptString *pstLeft_local;
  
  scriptContext = RecyclableObject::GetScriptContext(&pstLeft->super_RecyclableObject);
  this = ConcatStringMulti::New(3,pstLeft,pstCenter,scriptContext);
  ConcatStringMulti::SetItem(this,2,pstRight);
  return (JavascriptString *)this;
}

Assistant:

JavascriptString *
    JavascriptString::Concat3(JavascriptString * pstLeft, JavascriptString * pstCenter, JavascriptString * pstRight)
    {
        ConcatStringMulti * concatString = ConcatStringMulti::New(3, pstLeft, pstCenter, pstLeft->GetScriptContext());
        concatString->SetItem(2, pstRight);
        return concatString;
    }